

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

PostOrderTreeDFIterator<spvtools::opt::Loop> * __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
          (PostOrderTreeDFIterator<spvtools::opt::Loop> *this)

{
  PostOrderTreeDFIterator<spvtools::opt::Loop> *this_local;
  
  MoveToNextNode(this);
  return this;
}

Assistant:

PostOrderTreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }